

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O2

float __thiscall Assimp::XGLImporter::ReadFloat(XGLImporter *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  float t;
  char *s;
  
  bVar1 = SkipToText(this);
  if (bVar1) {
    iVar2 = (*((this->m_reader).
               super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->_vptr_IIrrXMLReader[0xe])();
    s = (char *)CONCAT44(extraout_var,iVar2);
    bVar1 = SkipSpaces<char>(&s);
    if ((bVar1) && (pcVar3 = fast_atoreal_move<float>(s,&t,true), pcVar3 != s)) {
      return t;
    }
  }
  LogFunctions<Assimp::XGLImporter>::LogError((char *)0x4f0973);
  return 0.0;
}

Assistant:

float XGLImporter::ReadFloat()
{
    if(!SkipToText()) {
        LogError("unexpected EOF reading float element contents");
        return 0.f;
    }
    const char* s = m_reader->getNodeData(), *se;

    if(!SkipSpaces(&s)) {
        LogError("unexpected EOL, failed to parse float");
        return 0.f;
    }

    float t;
    se = fast_atoreal_move(s,t);

    if (se == s) {
        LogError("failed to read float text");
        return 0.f;
    }

    return t;
}